

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O3

string * __thiscall
MetaCommand::ExtractDateFromCVS(string *__return_storage_ptr__,MetaCommand *this,string *date)

{
  bool bVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (date->_M_string_length - 9 < 0xfffffffffffffff8) {
    uVar2 = 8;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar1 = uVar2 < date->_M_string_length - 1;
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

METAIO_STL::string MetaCommand::ExtractDateFromCVS(METAIO_STL::string date)
{
  METAIO_STL::string newdate;
  for(unsigned int i=7; i < date.size()-1; ++i)
    {
    newdate += date[i];
    }
  return newdate;
}